

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

size_t decodeQuantum(uchar *dest,char *src)

{
  uchar uVar1;
  char *pcVar2;
  unsigned_long uVar3;
  char *p;
  unsigned_long x;
  unsigned_long i;
  char *s;
  size_t padding;
  char *src_local;
  uchar *dest_local;
  
  s = (char *)0x0;
  p = (char *)0x0;
  x = 0;
  i = (unsigned_long)src;
  do {
    if (3 < x) {
      if (s == (char *)0x0) {
        uVar1 = curlx_ultouc((ulong)p & 0xff);
        dest[2] = uVar1;
      }
      if (s < (char *)0x2) {
        uVar1 = curlx_ultouc((ulong)p >> 8 & 0xff);
        dest[1] = uVar1;
      }
      uVar1 = curlx_ultouc((ulong)p >> 0x10 & 0xff);
      *dest = uVar1;
      return 3 - (long)s;
    }
    if (*(char *)i == '=') {
      p = (char *)((long)p << 6);
      s = s + 1;
    }
    else {
      pcVar2 = strchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/=",
                      (int)*(char *)i);
      if (pcVar2 == (char *)0x0) {
        return 0;
      }
      uVar3 = curlx_uztoul((size_t)(pcVar2 + -0xc67c40));
      p = (char *)((long)p * 0x40 + uVar3);
    }
    x = x + 1;
    i = i + 1;
  } while( true );
}

Assistant:

static size_t decodeQuantum(unsigned char *dest, const char *src)
{
  size_t padding = 0;
  const char *s;
  unsigned long i, x = 0;

  for(i = 0, s = src; i < 4; i++, s++) {
    if(*s == '=') {
      x <<= 6;
      padding++;
    }
    else {
      const char *p = strchr(base64, *s);
      if(p)
        x = (x << 6) + curlx_uztoul(p - base64);
      else
        return 0;
    }
  }

  if(padding < 1)
    dest[2] = curlx_ultouc(x & 0xFFUL);

  x >>= 8;
  if(padding < 2)
    dest[1] = curlx_ultouc(x & 0xFFUL);

  x >>= 8;
  dest[0] = curlx_ultouc(x & 0xFFUL);

  return 3 - padding;
}